

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameColumnSelectCb(Walker *pWalker,Select *p)

{
  bool bVar1;
  Select *p_local;
  Walker *pWalker_local;
  
  bVar1 = (p->selFlags & 0x4200000) == 0;
  if (bVar1) {
    renameWalkWith(pWalker,p);
  }
  pWalker_local._4_4_ = (uint)!bVar1;
  return pWalker_local._4_4_;
}

Assistant:

static int renameColumnSelectCb(Walker *pWalker, Select *p){
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    testcase( p->selFlags & SF_View );
    testcase( p->selFlags & SF_CopyCte );
    return WRC_Prune;
  }
  renameWalkWith(pWalker, p);
  return WRC_Continue;
}